

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::iterator::recomputeBounds
          (iterator *this,uint32_t level)

{
  pointer pEVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *self;
  undefined8 *puVar10;
  
  if (level != 0) {
    pEVar1 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar4 = (ulong)level;
    do {
      uVar5 = uVar4 - 1;
      uVar6 = (ulong)pEVar1[uVar5].offset;
      pvVar2 = pEVar1[uVar5].node;
      uVar3 = *(ulong *)((long)pvVar2 + uVar6 * 8);
      puVar10 = (undefined8 *)(uVar3 & 0xffffffffffffffc0);
      if (uVar4 == (int)(this->super_const_iterator).path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1) {
        uVar8 = *puVar10;
        uVar4 = puVar10[1];
        if ((uVar3 & 0x3f) != 0) {
          uVar7 = 0;
          uVar9 = uVar4;
          do {
            uVar4 = *(ulong *)((long)puVar10 + uVar7 + 0x18);
            if (uVar4 < uVar9) {
              uVar4 = uVar9;
            }
            uVar7 = uVar7 + 0x10;
            uVar9 = uVar4;
          } while (((uint)uVar3 & 0x3f) << 4 != uVar7);
        }
      }
      else {
        uVar8 = puVar10[8];
        uVar4 = puVar10[9];
        if ((uVar3 & 0x3f) != 0) {
          uVar7 = 0;
          uVar9 = uVar4;
          do {
            uVar4 = *(ulong *)((long)puVar10 + uVar7 + 0x58);
            if (uVar4 < uVar9) {
              uVar4 = uVar9;
            }
            uVar7 = uVar7 + 0x10;
            uVar9 = uVar4;
          } while (((uint)uVar3 & 0x3f) << 4 != uVar7);
        }
      }
      *(undefined8 *)((long)pvVar2 + uVar6 * 0x10 + 0x40) = uVar8;
      *(ulong *)((long)pvVar2 + uVar6 * 0x10 + 0x48) = uVar4;
      uVar4 = uVar5;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::recomputeBounds(uint32_t level) {
    using namespace IntervalMapDetails;

    auto& path = this->path;
    while (level) {
        --level;
        auto offset = path.offset(level);
        interval<TKey>* key;
        NodeRef child;

        if (level == 0) {
            auto& branch = path.template node<RootBranch>(level);
            child = branch.childAt(offset);
            key = &branch.keyAt(offset);
        }
        else {
            auto& branch = path.template node<Branch>(level);
            child = branch.childAt(offset);
            key = &branch.keyAt(offset);
        }

        auto bounds = (level == path.height() - 1)
                          ? child.template get<Leaf>().getBounds(child.size())
                          : child.template get<Branch>().getBounds(child.size());
        *key = bounds;
    }
}